

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O0

double decode_half(int half)

{
  uint uVar1;
  uint uVar2;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_20;
  double val;
  int mant;
  int exp;
  int half_local;
  
  uVar1 = half >> 10 & 0x1f;
  uVar2 = half & 0x3ff;
  if (uVar1 == 0) {
    local_20 = ldexp((double)uVar2,-0x18);
  }
  else if (uVar1 == 0x1f) {
    local_24 = INFINITY;
    if (uVar2 != 0) {
      local_24 = NAN;
    }
    local_20 = (double)local_24;
  }
  else {
    local_20 = ldexp((double)(uVar2 + 0x400),uVar1 - 0x19);
  }
  if ((half & 0x8000U) == 0) {
    local_30 = local_20;
  }
  else {
    local_30 = -local_20;
  }
  return local_30;
}

Assistant:

static double decode_half(int half) {
  int exp = (half >> 10) & 0x1f;
  int mant = half & 0x3ff;
  double val;
  if (exp == 0) val = ldexp(mant, -24);
  else if (exp != 31) val = ldexp(mant + 1024, exp - 25);
  else val = mant == 0 ? INFINITY : NAN;
  return half & 0x8000 ? -val : val;
}